

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalNinjaMultiGenerator::BuildAlias
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *alias,
          string *config)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  if (config->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)alias);
  }
  else {
    local_38.View_._M_str = (alias->_M_dataplus)._M_p;
    local_38.View_._M_len = alias->_M_string_length;
    local_68.View_._M_len = 1;
    local_68.View_._M_str = ":";
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_38,&local_68,config);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildAlias(const std::string& alias,
                         const std::string& config) const override
  {
    if (config.empty()) {
      return alias;
    }
    return cmStrCat(alias, ":", config);
  }